

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdqsort.h
# Opt level: O2

bool pdqsort_detail::
     partial_insertion_sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,HighsCliqueTable::extractCliquesFromCut(HighsMipSolver_const&,int_const*,double_const*,int,double)::__1>
               (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> begin,
               __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> end,
               anon_class_8_1_8992ca70 comp)

{
  HighsInt p1;
  HighsInt *pHVar1;
  bool bVar2;
  HighsInt *pHVar3;
  HighsInt *pHVar4;
  HighsInt p2;
  long lVar5;
  bool bVar6;
  anon_class_8_1_8992ca70 local_50;
  HighsInt *local_48;
  ulong local_40;
  HighsInt *local_38;
  
  if (begin._M_current == end._M_current) {
LAB_0027f3b5:
    bVar6 = true;
  }
  else {
    local_40 = 0;
    local_50.vals = comp.vals;
    local_38 = begin._M_current;
    do {
      lVar5 = -(long)begin._M_current;
      pHVar3 = begin._M_current;
      do {
        begin._M_current = pHVar3 + 1;
        bVar6 = begin._M_current == end._M_current;
        if (bVar6) goto LAB_0027f3b5;
        p2 = *pHVar3;
        p1 = *begin._M_current;
        bVar2 = HighsCliqueTable::extractCliquesFromCut::anon_class_8_1_8992ca70::operator()
                          (&local_50,p1,p2);
        lVar5 = lVar5 + -4;
        pHVar3 = begin._M_current;
        pHVar1 = end._M_current;
      } while (!bVar2);
      do {
        local_48 = pHVar1;
        pHVar1 = pHVar3 + -1;
        *pHVar3 = p2;
        pHVar4 = local_38;
        if (pHVar1 == local_38) break;
        p2 = pHVar3[-2];
        bVar2 = HighsCliqueTable::extractCliquesFromCut::anon_class_8_1_8992ca70::operator()
                          (&local_50,p1,p2);
        pHVar3 = pHVar1;
        pHVar4 = pHVar1;
        pHVar1 = local_48;
      } while (bVar2);
      *pHVar4 = p1;
      local_40 = local_40 + (-(lVar5 + (long)pHVar4) >> 2);
      end._M_current = local_48;
    } while (local_40 < 9);
  }
  return bVar6;
}

Assistant:

inline bool partial_insertion_sort(Iter begin, Iter end, Compare comp) {
        typedef typename std::iterator_traits<Iter>::value_type T;
        if (begin == end) return true;
        
        std::size_t limit = 0;
        for (Iter cur = begin + 1; cur != end; ++cur) {
            Iter sift = cur;
            Iter sift_1 = cur - 1;

            // Compare first so we can avoid 2 moves for an element already positioned correctly.
            if (comp(*sift, *sift_1)) {
                T tmp = PDQSORT_PREFER_MOVE(*sift);

                do { *sift-- = PDQSORT_PREFER_MOVE(*sift_1); }
                while (sift != begin && comp(tmp, *--sift_1));

                *sift = PDQSORT_PREFER_MOVE(tmp);
                limit += cur - sift;
            }
            
            if (limit > partial_insertion_sort_limit) return false;
        }

        return true;
    }